

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_reader.c
# Opt level: O2

int dlep_reader_map_l2neigh_data(oonf_layer2_data *data,dlep_session *session,dlep_extension *ext)

{
  uint uVar1;
  dlep_neighbor_mapping *pdVar2;
  code *pcVar3;
  int iVar4;
  undefined8 uVar5;
  long lVar6;
  ulong uVar7;
  
  lVar6 = 0;
  uVar7 = 0;
  while( true ) {
    if (ext->neigh_mapping_count <= uVar7) {
      return 0;
    }
    pdVar2 = ext->neigh_mapping;
    pcVar3 = *(code **)((long)&pdVar2->from_tlv + lVar6);
    uVar1 = *(uint *)((long)&pdVar2->layer2 + lVar6);
    uVar5 = oonf_layer2_neigh_metadata_get();
    iVar4 = (*pcVar3)(data + uVar1,uVar5,session,*(undefined2 *)((long)&pdVar2->dlep + lVar6),
                      *(undefined8 *)((long)&pdVar2->scaling + lVar6));
    if (iVar4 != 0) break;
    uVar7 = uVar7 + 1;
    lVar6 = lVar6 + 0x40;
  }
  return ~(uint)uVar7;
}

Assistant:

int
dlep_reader_map_l2neigh_data(struct oonf_layer2_data *data, struct dlep_session *session,
    struct dlep_extension *ext) {
  struct dlep_neighbor_mapping *map;
  size_t i;

  for (i = 0; i < ext->neigh_mapping_count; i++) {
    map = &ext->neigh_mapping[i];

    if (map->from_tlv(&data[map->layer2], oonf_layer2_neigh_metadata_get(map->layer2), session,
        map->dlep, map->scaling)) {
      return -(i + 1);
    }
  }
  return 0;
}